

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  ImFont **ppIVar1;
  ImFont *pIVar2;
  ImFontConfig *pIVar3;
  ImFontAtlasCustomRect *ptr;
  uint uVar4;
  ulong uVar5;
  ImFontConfig *pIVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  
  if (this->Locked != false) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0x7b6,"void ImFontAtlas::ClearInputData()");
  }
  uVar4 = (this->ConfigData).Size;
  uVar5 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    pIVar6 = (this->ConfigData).Data;
    lVar8 = 0;
    lVar9 = 0;
    do {
      if ((*(void **)(pIVar6->Name + lVar8 + -0x56) != (void *)0x0) &&
         (pIVar6->Name[lVar8 + -0x4a] == '\x01')) {
        ImGui::MemFree(*(void **)(pIVar6->Name + lVar8 + -0x56));
        uVar5 = (ulong)(this->ConfigData).Size;
        if ((long)uVar5 <= lVar9) {
          pcVar7 = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
          goto LAB_0015f266;
        }
        pIVar6 = (this->ConfigData).Data;
        pcVar7 = pIVar6->Name + lVar8 + -0x56;
        pcVar7[0] = '\0';
        pcVar7[1] = '\0';
        pcVar7[2] = '\0';
        pcVar7[3] = '\0';
        pcVar7[4] = '\0';
        pcVar7[5] = '\0';
        pcVar7[6] = '\0';
        pcVar7[7] = '\0';
      }
      lVar9 = lVar9 + 1;
      uVar4 = (uint)uVar5;
      lVar8 = lVar8 + 0x88;
    } while (lVar9 < (int)uVar4);
  }
  lVar8 = (long)(this->Fonts).Size;
  if (lVar8 < 1) {
    pIVar6 = (this->ConfigData).Data;
  }
  else {
    ppIVar1 = (this->Fonts).Data;
    pIVar6 = (this->ConfigData).Data;
    lVar9 = 0;
    do {
      pIVar2 = ppIVar1[lVar9];
      pIVar3 = pIVar2->ConfigData;
      if ((pIVar6 <= pIVar3) && (pIVar3 < pIVar6 + (int)uVar4)) {
        pIVar2->ConfigData = (ImFontConfig *)0x0;
        if ((this->Fonts).Size <= lVar9) {
          pcVar7 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_0015f266:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                        ,0x68b,pcVar7);
        }
        ppIVar1[lVar9]->ConfigDataCount = 0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
  }
  if (pIVar6 != (ImFontConfig *)0x0) {
    (this->ConfigData).Size = 0;
    (this->ConfigData).Capacity = 0;
    ImGui::MemFree(pIVar6);
    (this->ConfigData).Data = (ImFontConfig *)0x0;
  }
  ptr = (this->CustomRects).Data;
  if (ptr != (ImFontAtlasCustomRect *)0x0) {
    (this->CustomRects).Size = 0;
    (this->CustomRects).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->CustomRects).Data = (ImFontAtlasCustomRect *)0x0;
  }
  this->PackIdMouseCursors = -1;
  this->PackIdLines = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
}